

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Last.hpp
# Opt level: O0

OUT * __thiscall
linq::
Last<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>,bool,int>>
          (OUT *__return_storage_ptr__,linq *this,
          GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
          *source)

{
  ulong uVar1;
  out_of_range *this_00;
  bool bVar2;
  undefined1 local_48 [8];
  OUT result;
  GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
  *source_local;
  
  (*(code *)**(undefined8 **)this)();
  uVar1 = (**(code **)(*(long *)this + 8))();
  if ((uVar1 & 1) != 0) {
    do {
      (**(code **)(*(long *)this + 0x18))(local_48);
      (**(code **)(*(long *)this + 0x10))();
      uVar1 = (**(code **)(*(long *)this + 8))();
      bVar2 = (uVar1 & 1) == 0;
      if (bVar2) {
        IGrouping<bool,_int_&>::IGrouping(__return_storage_ptr__,(IGrouping<bool,_int_&> *)local_48)
        ;
      }
      IGrouping<bool,_int_&>::~IGrouping((IGrouping<bool,_int_&> *)local_48);
    } while (!bVar2);
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"this");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

auto Last(S&& source)
	{
		source.Init();
		if(!source.Valid())
			throw std::out_of_range("this");

		while(true)
		{
			auto result = source.Current();
			source.Advance();

			if(!source.Valid())
				return result;
		}
	}